

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O0

void __thiscall QLineEdit::setPlaceholderText(QLineEdit *this,QString *placeholderText)

{
  bool bVar1;
  QLineEditPrivate *pQVar2;
  QLineEditPrivate *in_RSI;
  QString *in_RDI;
  QLineEditPrivate *d;
  QWidget *in_stack_ffffffffffffffd8;
  
  pQVar2 = d_func((QLineEdit *)0x5c39a1);
  bVar1 = ::operator!=(in_RDI,(QString *)in_stack_ffffffffffffffd8);
  if (bVar1) {
    QString::operator=(&pQVar2->placeholderText,(QString *)in_RSI);
    bVar1 = QLineEditPrivate::shouldShowPlaceholderText(in_RSI);
    if (bVar1) {
      QWidget::update(in_stack_ffffffffffffffd8);
    }
  }
  return;
}

Assistant:

void QLineEdit::setPlaceholderText(const QString& placeholderText)
{
    Q_D(QLineEdit);
    if (d->placeholderText != placeholderText) {
        d->placeholderText = placeholderText;
        if (d->shouldShowPlaceholderText())
            update();
    }
}